

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementTetraCorot_10.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementTetraCorot_10::ComputeMatrB
          (ChElementTetraCorot_10 *this,ChMatrixDynamic<> *mmatrB,double zeta1,double zeta2,
          double zeta3,double zeta4,double *JacobianDet)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  long lVar22;
  double *pdVar23;
  ulong uVar24;
  ulong uVar25;
  ActualDstType actualDst;
  long lVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [64];
  Scalar SVar30;
  double dVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  double dVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  double dVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  double dVar65;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  ChMatrixDynamic<> Jacobian;
  DenseStorage<double,__1,__1,__1,_1> local_58;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  
  local_58.m_data = (double *)0x0;
  local_58.m_rows = 0;
  local_58.m_cols = 0;
  local_38 = zeta3;
  local_30 = zeta2;
  local_28 = zeta1;
  local_20 = zeta4;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&local_58,0x10,4,4);
  (*(this->super_ChElementTetrahedron)._vptr_ChElementTetrahedron[10])
            (local_28,local_30,local_38,local_20,this,&local_58);
  SVar30 = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::determinant
                     ((MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&local_58);
  *JacobianDet = SVar30;
  if ((((2 < local_58.m_rows) && (3 < local_58.m_cols)) && (local_58.m_rows != 3)) &&
     ((lVar26 = (mmatrB->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage
                .m_rows, 0 < lVar26 &&
      (lVar22 = (mmatrB->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage
                .m_cols, 0 < lVar22)))) {
    auVar32 = ZEXT816(0x4010000000000000);
    auVar28._8_8_ = 0;
    auVar28._0_8_ = local_28;
    auVar28 = vfmadd231sd_fma(ZEXT816(0xbff0000000000000),auVar32,auVar28);
    pdVar23 = (mmatrB->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.
              m_data;
    auVar27._8_8_ = 0;
    auVar27._0_8_ =
         (local_58.m_data[local_58.m_cols * 3 + 3] - local_58.m_data[local_58.m_cols * 3 + 1]) *
         (local_58.m_data[local_58.m_cols * 2 + 2] - local_58.m_data[local_58.m_cols * 2 + 1]);
    auVar53._8_8_ = 0;
    auVar53._0_8_ =
         local_58.m_data[local_58.m_cols * 2 + 3] - local_58.m_data[local_58.m_cols * 2 + 1];
    auVar107._8_8_ = 0;
    auVar107._0_8_ =
         local_58.m_data[local_58.m_cols * 3 + 2] - local_58.m_data[local_58.m_cols * 3 + 1];
    auVar27 = vfmsub231sd_fma(auVar27,auVar53,auVar107);
    dVar65 = auVar28._0_8_;
    *pdVar23 = (dVar65 * auVar27._0_8_) / SVar30;
    if (3 < lVar22) {
      auVar5._8_8_ = 0;
      auVar5._0_8_ = local_30;
      auVar28 = vfmadd231sd_fma(ZEXT816(0xbff0000000000000),auVar32,auVar5);
      auVar45._8_8_ = 0;
      auVar45._0_8_ =
           local_58.m_data[local_58.m_cols * 2 + 2] - local_58.m_data[local_58.m_cols * 2];
      auVar71._8_8_ = 0;
      auVar71._0_8_ =
           (local_58.m_data[local_58.m_cols * 3] - local_58.m_data[local_58.m_cols * 3 + 2]) *
           (local_58.m_data[local_58.m_cols * 2 + 2] - local_58.m_data[local_58.m_cols * 2 + 3]);
      auVar108._8_8_ = 0;
      auVar108._0_8_ =
           local_58.m_data[local_58.m_cols * 3 + 3] - local_58.m_data[local_58.m_cols * 3 + 2];
      auVar27 = vfmsub231sd_fma(auVar71,auVar108,auVar45);
      dVar52 = auVar28._0_8_;
      pdVar23[3] = (dVar52 * auVar27._0_8_) / SVar30;
      if (6 < lVar22) {
        auVar6._8_8_ = 0;
        auVar6._0_8_ = local_38;
        auVar28 = vfmadd231sd_fma(ZEXT816(0xbff0000000000000),auVar32,auVar6);
        auVar72._8_8_ = 0;
        auVar72._0_8_ =
             local_58.m_data[local_58.m_cols * 3] - local_58.m_data[local_58.m_cols * 3 + 3];
        auVar109._8_8_ = 0;
        auVar109._0_8_ =
             (local_58.m_data[local_58.m_cols * 2] - local_58.m_data[local_58.m_cols * 2 + 3]) *
             (local_58.m_data[local_58.m_cols * 3 + 1] - local_58.m_data[local_58.m_cols * 3 + 3]);
        auVar135._8_8_ = 0;
        auVar135._0_8_ =
             local_58.m_data[local_58.m_cols * 2 + 1] - local_58.m_data[local_58.m_cols * 2 + 3];
        auVar27 = vfmsub231sd_fma(auVar109,auVar72,auVar135);
        dVar44 = auVar28._0_8_;
        pdVar23[6] = (dVar44 * auVar27._0_8_) / SVar30;
        if (9 < lVar22) {
          auVar73._8_8_ = 0;
          auVar73._0_8_ = local_20;
          auVar28 = vfmadd213sd_fma(auVar32,auVar73,ZEXT816(0xbff0000000000000));
          auVar32._8_8_ = 0;
          auVar32._0_8_ =
               (local_58.m_data[local_58.m_cols * 3 + 2] - local_58.m_data[local_58.m_cols * 3]) *
               (local_58.m_data[local_58.m_cols * 2] - local_58.m_data[local_58.m_cols * 2 + 1]);
          auVar110._8_8_ = 0;
          auVar110._0_8_ =
               local_58.m_data[local_58.m_cols * 2] - local_58.m_data[local_58.m_cols * 2 + 2];
          auVar160._8_8_ = 0;
          auVar160._0_8_ =
               local_58.m_data[local_58.m_cols * 3 + 1] - local_58.m_data[local_58.m_cols * 3];
          auVar27 = vfmsub231sd_fma(auVar32,auVar160,auVar110);
          dVar31 = auVar28._0_8_;
          pdVar23[9] = (dVar31 * auVar27._0_8_) / SVar30;
          if (0xc < lVar22) {
            dVar1 = local_58.m_data[local_58.m_cols * 2 + 2];
            dVar2 = local_58.m_data[local_58.m_cols * 3 + 2];
            auVar111._8_8_ = 0;
            auVar111._0_8_ =
                 (local_58.m_data[local_58.m_cols * 3] - dVar2) *
                 (dVar1 - local_58.m_data[local_58.m_cols * 2 + 3]);
            auVar183._8_8_ = 0;
            auVar183._0_8_ = dVar1 - local_58.m_data[local_58.m_cols * 2];
            auVar189._8_8_ = 0;
            auVar189._0_8_ = local_58.m_data[local_58.m_cols * 3 + 3] - dVar2;
            auVar28 = vfmsub231sd_fma(auVar111,auVar183,auVar189);
            auVar74._8_8_ = 0;
            auVar74._0_8_ =
                 local_58.m_data[local_58.m_cols * 2 + 3] - local_58.m_data[local_58.m_cols * 2 + 1]
            ;
            auVar136._8_8_ = 0;
            auVar136._0_8_ =
                 (local_58.m_data[local_58.m_cols * 3 + 3] -
                 local_58.m_data[local_58.m_cols * 3 + 1]) *
                 (dVar1 - local_58.m_data[local_58.m_cols * 2 + 1]);
            auVar171._8_8_ = 0;
            auVar171._0_8_ = dVar2 - local_58.m_data[local_58.m_cols * 3 + 1];
            auVar27 = vfmsub231sd_fma(auVar136,auVar171,auVar74);
            auVar193._8_8_ = 0;
            auVar193._0_8_ = local_30;
            auVar27 = vmulsd_avx512f(auVar27,auVar193);
            auVar7._8_8_ = 0;
            auVar7._0_8_ = local_28;
            auVar28 = vfmadd231sd_fma(auVar27,auVar28,auVar7);
            pdVar23[0xc] = (auVar28._0_8_ * 4.0) / SVar30;
            if (0xf < lVar22) {
              dVar1 = local_58.m_data[local_58.m_cols * 2 + 3];
              dVar2 = local_58.m_data[local_58.m_cols * 3 + 3];
              auVar112._8_8_ = 0;
              auVar112._0_8_ =
                   (local_58.m_data[local_58.m_cols * 3 + 1] - dVar2) *
                   (local_58.m_data[local_58.m_cols * 2] - dVar1);
              auVar179._8_8_ = 0;
              auVar179._0_8_ = local_58.m_data[local_58.m_cols * 2 + 1] - dVar1;
              auVar190._8_8_ = 0;
              auVar190._0_8_ = local_58.m_data[local_58.m_cols * 3] - dVar2;
              auVar28 = vfmsub231sd_fma(auVar112,auVar179,auVar190);
              auVar75._8_8_ = 0;
              auVar75._0_8_ =
                   local_58.m_data[local_58.m_cols * 2 + 2] - local_58.m_data[local_58.m_cols * 2];
              auVar137._8_8_ = 0;
              auVar137._0_8_ =
                   (local_58.m_data[local_58.m_cols * 3] - local_58.m_data[local_58.m_cols * 3 + 2])
                   * (local_58.m_data[local_58.m_cols * 2 + 2] - dVar1);
              auVar166._8_8_ = 0;
              auVar166._0_8_ = dVar2 - local_58.m_data[local_58.m_cols * 3 + 2];
              auVar27 = vfmsub231sd_fma(auVar137,auVar166,auVar75);
              auVar191._8_8_ = 0;
              auVar191._0_8_ = local_38;
              auVar76._8_8_ = 0;
              auVar76._0_8_ = local_38 * auVar27._0_8_;
              auVar28 = vfmadd231sd_avx512f(auVar76,auVar193,auVar28);
              pdVar23[0xf] = (auVar28._0_8_ * 4.0) / SVar30;
              if (0x12 < lVar22) {
                dVar1 = local_58.m_data[local_58.m_cols * 2 + 3];
                dVar2 = local_58.m_data[local_58.m_cols * 2 + 1];
                dVar3 = local_58.m_data[local_58.m_cols * 3 + 3];
                dVar4 = local_58.m_data[local_58.m_cols * 3 + 1];
                auVar77._8_8_ = 0;
                auVar77._0_8_ = dVar1 - dVar2;
                auVar138._8_8_ = 0;
                auVar138._0_8_ =
                     (dVar3 - dVar4) * (local_58.m_data[local_58.m_cols * 2 + 2] - dVar2);
                auVar180._8_8_ = 0;
                auVar180._0_8_ = local_58.m_data[local_58.m_cols * 3 + 2] - dVar4;
                auVar28 = vfmsub231sd_fma(auVar138,auVar77,auVar180);
                auVar78._8_8_ = 0;
                auVar78._0_8_ = (dVar4 - dVar3) * (local_58.m_data[local_58.m_cols * 2] - dVar1);
                auVar161._8_8_ = 0;
                auVar161._0_8_ = local_58.m_data[local_58.m_cols * 3] - dVar3;
                auVar172._8_8_ = 0;
                auVar172._0_8_ = dVar2 - dVar1;
                auVar27 = vfmsub231sd_fma(auVar78,auVar161,auVar172);
                auVar196._8_8_ = 0;
                auVar196._0_8_ = local_28;
                auVar27 = vmulsd_avx512f(auVar27,auVar196);
                auVar28 = vfmadd231sd_fma(auVar27,auVar191,auVar28);
                pdVar23[0x12] = (auVar28._0_8_ * 4.0) / SVar30;
                if (0x15 < lVar22) {
                  dVar1 = local_58.m_data[local_58.m_cols * 2 + 1];
                  dVar2 = local_58.m_data[local_58.m_cols * 3 + 1];
                  auVar113._8_8_ = 0;
                  auVar113._0_8_ =
                       local_58.m_data[local_58.m_cols * 2] -
                       local_58.m_data[local_58.m_cols * 2 + 2];
                  auVar139._8_8_ = 0;
                  auVar139._0_8_ =
                       (local_58.m_data[local_58.m_cols * 3 + 2] -
                       local_58.m_data[local_58.m_cols * 3]) *
                       (local_58.m_data[local_58.m_cols * 2] - dVar1);
                  auVar192._8_8_ = 0;
                  auVar192._0_8_ = dVar2 - local_58.m_data[local_58.m_cols * 3];
                  auVar28 = vfmsub231sd_fma(auVar139,auVar113,auVar192);
                  auVar79._8_8_ = 0;
                  auVar79._0_8_ =
                       (local_58.m_data[local_58.m_cols * 2 + 2] - dVar1) *
                       (local_58.m_data[local_58.m_cols * 3 + 3] - dVar2);
                  auVar184._8_8_ = 0;
                  auVar184._0_8_ = local_58.m_data[local_58.m_cols * 3 + 2] - dVar2;
                  auVar187._8_8_ = 0;
                  auVar187._0_8_ = local_58.m_data[local_58.m_cols * 2 + 3] - dVar1;
                  auVar27 = vfmsub231sd_fma(auVar79,auVar184,auVar187);
                  auVar194._8_8_ = 0;
                  auVar194._0_8_ = local_20;
                  auVar27 = vmulsd_avx512f(auVar27,auVar194);
                  auVar28 = vfmadd231sd_avx512f(auVar27,auVar196,auVar28);
                  pdVar23[0x15] = (auVar28._0_8_ * 4.0) / SVar30;
                  if (0x18 < lVar22) {
                    dVar1 = local_58.m_data[local_58.m_cols * 2];
                    dVar2 = local_58.m_data[local_58.m_cols * 2 + 2];
                    dVar3 = local_58.m_data[local_58.m_cols * 3 + 2];
                    dVar4 = local_58.m_data[local_58.m_cols * 3];
                    auVar80._8_8_ = 0;
                    auVar80._0_8_ =
                         (dVar3 - dVar4) * (dVar1 - local_58.m_data[local_58.m_cols * 2 + 1]);
                    auVar114._8_8_ = 0;
                    auVar114._0_8_ = dVar1 - dVar2;
                    auVar181._8_8_ = 0;
                    auVar181._0_8_ = local_58.m_data[local_58.m_cols * 3 + 1] - dVar4;
                    auVar28 = vfmsub231sd_fma(auVar80,auVar114,auVar181);
                    auVar115._8_8_ = 0;
                    auVar115._0_8_ =
                         (dVar4 - dVar3) * (dVar2 - local_58.m_data[local_58.m_cols * 2 + 3]);
                    auVar152._8_8_ = 0;
                    auVar152._0_8_ = local_58.m_data[local_58.m_cols * 3 + 3] - dVar3;
                    auVar167._8_8_ = 0;
                    auVar167._0_8_ = dVar2 - dVar1;
                    auVar27 = vfmsub231sd_fma(auVar115,auVar152,auVar167);
                    auVar27 = vmulsd_avx512f(auVar27,auVar194);
                    auVar8._8_8_ = 0;
                    auVar8._0_8_ = local_30;
                    auVar28 = vfmadd231sd_fma(auVar27,auVar28,auVar8);
                    pdVar23[0x18] = (auVar28._0_8_ * 4.0) / SVar30;
                    if (0x1b < lVar22) {
                      dVar1 = local_58.m_data[local_58.m_cols * 2];
                      dVar2 = local_58.m_data[local_58.m_cols * 3];
                      auVar116._8_8_ = 0;
                      auVar116._0_8_ =
                           (local_58.m_data[local_58.m_cols * 3 + 2] - dVar2) *
                           (dVar1 - local_58.m_data[local_58.m_cols * 2 + 1]);
                      auVar185._8_8_ = 0;
                      auVar185._0_8_ = dVar1 - local_58.m_data[local_58.m_cols * 2 + 2];
                      auVar188._8_8_ = 0;
                      auVar188._0_8_ = local_58.m_data[local_58.m_cols * 3 + 1] - dVar2;
                      auVar28 = vfmsub231sd_fma(auVar116,auVar185,auVar188);
                      auVar81._8_8_ = 0;
                      auVar81._0_8_ =
                           local_58.m_data[local_58.m_cols * 2 + 1] -
                           local_58.m_data[local_58.m_cols * 2 + 3];
                      auVar140._8_8_ = 0;
                      auVar140._0_8_ =
                           (dVar1 - local_58.m_data[local_58.m_cols * 2 + 3]) *
                           (local_58.m_data[local_58.m_cols * 3 + 1] -
                           local_58.m_data[local_58.m_cols * 3 + 3]);
                      auVar182._8_8_ = 0;
                      auVar182._0_8_ = dVar2 - local_58.m_data[local_58.m_cols * 3 + 3];
                      auVar27 = vfmsub231sd_fma(auVar140,auVar182,auVar81);
                      auVar195._8_8_ = 0;
                      auVar195._0_8_ = local_20;
                      auVar27 = vmulsd_avx512f(auVar27,auVar195);
                      auVar9._8_8_ = 0;
                      auVar9._0_8_ = local_38;
                      auVar28 = vfmadd231sd_fma(auVar27,auVar28,auVar9);
                      pdVar23[0x1b] = (auVar28._0_8_ * 4.0) / SVar30;
                      if (lVar26 != 1) {
                        auVar82._8_8_ = 0;
                        auVar82._0_8_ =
                             (local_58.m_data[local_58.m_cols * 3 + 2] -
                             local_58.m_data[local_58.m_cols * 3 + 1]) *
                             (local_58.m_data[local_58.m_cols + 3] -
                             local_58.m_data[local_58.m_cols + 1]);
                        auVar153._8_8_ = 0;
                        auVar153._0_8_ =
                             local_58.m_data[local_58.m_cols + 2] -
                             local_58.m_data[local_58.m_cols + 1];
                        auVar168._8_8_ = 0;
                        auVar168._0_8_ =
                             local_58.m_data[local_58.m_cols * 3 + 3] -
                             local_58.m_data[local_58.m_cols * 3 + 1];
                        auVar28 = vfmsub231sd_fma(auVar82,auVar168,auVar153);
                        pdVar23[lVar22 + 1] = (dVar65 * auVar28._0_8_) / SVar30;
                        if (((1 < local_58.m_rows) && (2 < local_58.m_cols)) &&
                           ((3 < local_58.m_rows &&
                            (((local_58.m_cols != 3 &&
                              (1 < (mmatrB->
                                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>)
                                   .m_storage.m_rows)) &&
                             (lVar26 = (mmatrB->
                                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                       ).m_storage.m_cols, 4 < lVar26)))))) {
                          auVar83._8_8_ = 0;
                          auVar83._0_8_ =
                               (local_58.m_data[local_58.m_cols * 3 + 2] -
                               local_58.m_data[local_58.m_cols * 3 + 3]) *
                               (local_58.m_data[local_58.m_cols] -
                               local_58.m_data[local_58.m_cols + 2]);
                          auVar117._8_8_ = 0;
                          auVar117._0_8_ =
                               local_58.m_data[local_58.m_cols + 3] -
                               local_58.m_data[local_58.m_cols + 2];
                          auVar141._8_8_ = 0;
                          auVar141._0_8_ =
                               local_58.m_data[local_58.m_cols * 3 + 2] -
                               local_58.m_data[local_58.m_cols * 3];
                          auVar28 = vfmsub231sd_fma(auVar83,auVar117,auVar141);
                          (mmatrB->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>)
                          .m_storage.m_data[lVar26 + 4] = (dVar52 * auVar28._0_8_) / SVar30;
                          if (((1 < local_58.m_rows) && (0 < local_58.m_cols)) &&
                             ((3 < local_58.m_cols &&
                              (((3 < local_58.m_rows &&
                                (1 < (mmatrB->
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                     ).m_storage.m_rows)) &&
                               (lVar26 = (mmatrB->
                                         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                         ).m_storage.m_cols, 7 < lVar26)))))) {
                            auVar84._8_8_ = 0;
                            auVar84._0_8_ =
                                 local_58.m_data[local_58.m_cols] -
                                 local_58.m_data[local_58.m_cols + 3];
                            auVar118._8_8_ = 0;
                            auVar118._0_8_ =
                                 (local_58.m_data[local_58.m_cols * 3] -
                                 local_58.m_data[local_58.m_cols * 3 + 3]) *
                                 (local_58.m_data[local_58.m_cols + 1] -
                                 local_58.m_data[local_58.m_cols + 3]);
                            auVar154._8_8_ = 0;
                            auVar154._0_8_ =
                                 local_58.m_data[local_58.m_cols * 3 + 1] -
                                 local_58.m_data[local_58.m_cols * 3 + 3];
                            auVar28 = vfmsub231sd_fma(auVar118,auVar84,auVar154);
                            (mmatrB->
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).
                            m_storage.m_data[lVar26 + 7] = (dVar44 * auVar28._0_8_) / SVar30;
                            if (((((1 < local_58.m_rows) && (1 < local_58.m_cols)) &&
                                 (3 < local_58.m_rows)) &&
                                ((local_58.m_cols != 2 &&
                                 (1 < (mmatrB->
                                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                      ).m_storage.m_rows)))) &&
                               (lVar26 = (mmatrB->
                                         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                         ).m_storage.m_cols, 10 < lVar26)) {
                              auVar85._8_8_ = 0;
                              auVar85._0_8_ =
                                   (local_58.m_data[local_58.m_cols * 3] -
                                   local_58.m_data[local_58.m_cols * 3 + 1]) *
                                   (local_58.m_data[local_58.m_cols + 2] -
                                   local_58.m_data[local_58.m_cols]);
                              auVar119._8_8_ = 0;
                              auVar119._0_8_ =
                                   local_58.m_data[local_58.m_cols + 1] -
                                   local_58.m_data[local_58.m_cols];
                              auVar155._8_8_ = 0;
                              auVar155._0_8_ =
                                   local_58.m_data[local_58.m_cols * 3] -
                                   local_58.m_data[local_58.m_cols * 3 + 2];
                              auVar28 = vfmsub231sd_fma(auVar85,auVar119,auVar155);
                              (mmatrB->
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).
                              m_storage.m_data[lVar26 + 10] = (dVar31 * auVar28._0_8_) / SVar30;
                              if (((1 < local_58.m_rows) && (3 < local_58.m_cols)) &&
                                 ((3 < local_58.m_rows &&
                                  ((1 < (mmatrB->
                                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                        ).m_storage.m_rows &&
                                   (lVar26 = (mmatrB->
                                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                             ).m_storage.m_cols, 0xd < lVar26)))))) {
                                dVar1 = local_58.m_data[local_58.m_cols + 2];
                                dVar2 = local_58.m_data[local_58.m_cols * 3 + 2];
                                auVar142._8_8_ = 0;
                                auVar142._0_8_ = local_58.m_data[local_58.m_cols + 3] - dVar1;
                                auVar169._8_8_ = 0;
                                auVar169._0_8_ = dVar2 - local_58.m_data[local_58.m_cols * 3];
                                auVar173._8_8_ = 0;
                                auVar173._0_8_ =
                                     (dVar2 - local_58.m_data[local_58.m_cols * 3 + 3]) *
                                     (local_58.m_data[local_58.m_cols] - dVar1);
                                auVar28 = vfmsub231sd_fma(auVar173,auVar142,auVar169);
                                auVar86._8_8_ = 0;
                                auVar86._0_8_ =
                                     (dVar2 - local_58.m_data[local_58.m_cols * 3 + 1]) *
                                     (local_58.m_data[local_58.m_cols + 3] -
                                     local_58.m_data[local_58.m_cols + 1]);
                                auVar120._8_8_ = 0;
                                auVar120._0_8_ = dVar1 - local_58.m_data[local_58.m_cols + 1];
                                auVar143._8_8_ = 0;
                                auVar143._0_8_ =
                                     local_58.m_data[local_58.m_cols * 3 + 3] -
                                     local_58.m_data[local_58.m_cols * 3 + 1];
                                auVar27 = vfmsub231sd_fma(auVar86,auVar120,auVar143);
                                auVar10._8_8_ = 0;
                                auVar10._0_8_ = local_28;
                                auVar87._8_8_ = 0;
                                auVar87._0_8_ = auVar27._0_8_ * local_30;
                                auVar28 = vfmadd231sd_fma(auVar87,auVar28,auVar10);
                                (mmatrB->
                                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).
                                m_storage.m_data[lVar26 + 0xd] = (auVar28._0_8_ * 4.0) / SVar30;
                                if ((1 < local_58.m_rows) &&
                                   ((((0 < local_58.m_cols && (3 < local_58.m_cols)) &&
                                     (3 < local_58.m_rows)) &&
                                    ((1 < (mmatrB->
                                          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                          ).m_storage.m_rows &&
                                     (lVar26 = (mmatrB->
                                               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                               ).m_storage.m_cols, 0x10 < lVar26)))))) {
                                  dVar1 = local_58.m_data[local_58.m_cols + 3];
                                  dVar2 = local_58.m_data[local_58.m_cols * 3 + 3];
                                  auVar144._8_8_ = 0;
                                  auVar144._0_8_ = local_58.m_data[local_58.m_cols] - dVar1;
                                  auVar162._8_8_ = 0;
                                  auVar162._0_8_ = local_58.m_data[local_58.m_cols * 3 + 1] - dVar2;
                                  auVar174._8_8_ = 0;
                                  auVar174._0_8_ =
                                       (local_58.m_data[local_58.m_cols * 3] - dVar2) *
                                       (local_58.m_data[local_58.m_cols + 1] - dVar1);
                                  auVar28 = vfmsub231sd_fma(auVar174,auVar144,auVar162);
                                  auVar88._8_8_ = 0;
                                  auVar88._0_8_ =
                                       (local_58.m_data[local_58.m_cols * 3 + 2] - dVar2) *
                                       (local_58.m_data[local_58.m_cols] -
                                       local_58.m_data[local_58.m_cols + 2]);
                                  auVar121._8_8_ = 0;
                                  auVar121._0_8_ = dVar1 - local_58.m_data[local_58.m_cols + 2];
                                  auVar156._8_8_ = 0;
                                  auVar156._0_8_ =
                                       local_58.m_data[local_58.m_cols * 3 + 2] -
                                       local_58.m_data[local_58.m_cols * 3];
                                  auVar27 = vfmsub231sd_fma(auVar88,auVar121,auVar156);
                                  auVar11._8_8_ = 0;
                                  auVar11._0_8_ = local_30;
                                  auVar89._8_8_ = 0;
                                  auVar89._0_8_ = auVar27._0_8_ * local_38;
                                  auVar28 = vfmadd231sd_fma(auVar89,auVar28,auVar11);
                                  (mmatrB->
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).
                                  m_storage.m_data[lVar26 + 0x10] = (auVar28._0_8_ * 4.0) / SVar30;
                                  if ((((1 < local_58.m_rows) &&
                                       ((2 < local_58.m_cols && (3 < local_58.m_rows)))) &&
                                      (local_58.m_cols != 3)) &&
                                     ((1 < (mmatrB->
                                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                           ).m_storage.m_rows &&
                                      (lVar26 = (mmatrB->
                                                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                ).m_storage.m_cols, 0x13 < lVar26)))) {
                                    dVar1 = local_58.m_data[local_58.m_cols + 1];
                                    dVar2 = local_58.m_data[local_58.m_cols * 3 + 3];
                                    dVar3 = local_58.m_data[local_58.m_cols * 3 + 1];
                                    dVar4 = local_58.m_data[local_58.m_cols + 3];
                                    auVar90._8_8_ = 0;
                                    auVar90._0_8_ = local_58.m_data[local_58.m_cols + 2] - dVar1;
                                    auVar175._8_8_ = 0;
                                    auVar175._0_8_ = dVar2 - dVar3;
                                    auVar186._8_8_ = 0;
                                    auVar186._0_8_ =
                                         (local_58.m_data[local_58.m_cols * 3 + 2] - dVar3) *
                                         (dVar4 - dVar1);
                                    auVar28 = vfmsub231sd_fma(auVar186,auVar90,auVar175);
                                    auVar91._8_8_ = 0;
                                    auVar91._0_8_ = local_58.m_data[local_58.m_cols] - dVar4;
                                    auVar122._8_8_ = 0;
                                    auVar122._0_8_ = dVar3 - dVar2;
                                    auVar145._8_8_ = 0;
                                    auVar145._0_8_ =
                                         (local_58.m_data[local_58.m_cols * 3] - dVar2) *
                                         (dVar1 - dVar4);
                                    auVar27 = vfmsub231sd_fma(auVar145,auVar91,auVar122);
                                    auVar12._8_8_ = 0;
                                    auVar12._0_8_ = local_38;
                                    auVar92._8_8_ = 0;
                                    auVar92._0_8_ = auVar27._0_8_ * local_28;
                                    auVar28 = vfmadd231sd_fma(auVar92,auVar28,auVar12);
                                    (mmatrB->
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                    ).m_storage.m_data[lVar26 + 0x13] =
                                         (auVar28._0_8_ * 4.0) / SVar30;
                                    if (((1 < local_58.m_rows) &&
                                        (((1 < local_58.m_cols && (3 < local_58.m_rows)) &&
                                         (local_58.m_cols != 2)))) &&
                                       (((3 < local_58.m_cols &&
                                         (1 < (mmatrB->
                                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                              ).m_storage.m_rows)) &&
                                        (lVar26 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 0x16 < lVar26)))) {
                                      dVar1 = local_58.m_data[local_58.m_cols + 1];
                                      dVar2 = local_58.m_data[local_58.m_cols * 3 + 1];
                                      auVar93._8_8_ = 0;
                                      auVar93._0_8_ =
                                           (local_58.m_data[local_58.m_cols * 3] - dVar2) *
                                           (local_58.m_data[local_58.m_cols + 2] -
                                           local_58.m_data[local_58.m_cols]);
                                      auVar146._8_8_ = 0;
                                      auVar146._0_8_ = dVar1 - local_58.m_data[local_58.m_cols];
                                      auVar176._8_8_ = 0;
                                      auVar176._0_8_ =
                                           local_58.m_data[local_58.m_cols * 3] -
                                           local_58.m_data[local_58.m_cols * 3 + 2];
                                      auVar28 = vfmsub231sd_fma(auVar93,auVar146,auVar176);
                                      auVar123._8_8_ = 0;
                                      auVar123._0_8_ =
                                           (local_58.m_data[local_58.m_cols * 3 + 2] - dVar2) *
                                           (local_58.m_data[local_58.m_cols + 3] - dVar1);
                                      auVar147._8_8_ = 0;
                                      auVar147._0_8_ = local_58.m_data[local_58.m_cols + 2] - dVar1;
                                      auVar163._8_8_ = 0;
                                      auVar163._0_8_ =
                                           local_58.m_data[local_58.m_cols * 3 + 3] - dVar2;
                                      auVar27 = vfmsub231sd_fma(auVar123,auVar147,auVar163);
                                      auVar13._8_8_ = 0;
                                      auVar13._0_8_ = local_28;
                                      auVar124._8_8_ = 0;
                                      auVar124._0_8_ = auVar27._0_8_ * local_20;
                                      auVar28 = vfmadd231sd_fma(auVar124,auVar28,auVar13);
                                      (mmatrB->
                                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                      ).m_storage.m_data[lVar26 + 0x16] =
                                           (auVar28._0_8_ * 4.0) / SVar30;
                                      if (((1 < local_58.m_rows) && (1 < local_58.m_cols)) &&
                                         ((3 < local_58.m_rows &&
                                          ((((local_58.m_cols != 2 && (3 < local_58.m_cols)) &&
                                            (1 < (mmatrB->
                                                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                 ).m_storage.m_rows)) &&
                                           (lVar26 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 0x19 < lVar26)))))) {
                                        dVar1 = local_58.m_data[local_58.m_cols];
                                        dVar2 = local_58.m_data[local_58.m_cols * 3];
                                        dVar3 = local_58.m_data[local_58.m_cols * 3 + 2];
                                        dVar4 = local_58.m_data[local_58.m_cols + 2];
                                        auVar125._8_8_ = 0;
                                        auVar125._0_8_ =
                                             local_58.m_data[local_58.m_cols + 1] - dVar1;
                                        auVar164._8_8_ = 0;
                                        auVar164._0_8_ = dVar2 - dVar3;
                                        auVar177._8_8_ = 0;
                                        auVar177._0_8_ =
                                             (dVar2 - local_58.m_data[local_58.m_cols * 3 + 1]) *
                                             (dVar4 - dVar1);
                                        auVar28 = vfmsub231sd_fma(auVar177,auVar125,auVar164);
                                        auVar94._8_8_ = 0;
                                        auVar94._0_8_ =
                                             (dVar3 - local_58.m_data[local_58.m_cols * 3 + 3]) *
                                             (dVar1 - dVar4);
                                        auVar126._8_8_ = 0;
                                        auVar126._0_8_ =
                                             local_58.m_data[local_58.m_cols + 3] - dVar4;
                                        auVar148._8_8_ = 0;
                                        auVar148._0_8_ = dVar3 - dVar2;
                                        auVar27 = vfmsub231sd_fma(auVar94,auVar126,auVar148);
                                        auVar14._8_8_ = 0;
                                        auVar14._0_8_ = local_30;
                                        auVar95._8_8_ = 0;
                                        auVar95._0_8_ = auVar27._0_8_ * local_20;
                                        auVar28 = vfmadd231sd_fma(auVar95,auVar28,auVar14);
                                        (mmatrB->
                                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                        ).m_storage.m_data[lVar26 + 0x19] =
                                             (auVar28._0_8_ * 4.0) / SVar30;
                                        if (((1 < local_58.m_rows) && (1 < local_58.m_cols)) &&
                                           ((3 < local_58.m_rows &&
                                            (((local_58.m_cols != 2 && (3 < local_58.m_cols)) &&
                                             ((1 < (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows &&
                                              (lVar26 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 0x1c < lVar26)))))))) {
                                          dVar1 = local_58.m_data[local_58.m_cols];
                                          dVar2 = local_58.m_data[local_58.m_cols * 3];
                                          auVar149._8_8_ = 0;
                                          auVar149._0_8_ =
                                               local_58.m_data[local_58.m_cols + 1] - dVar1;
                                          auVar165._8_8_ = 0;
                                          auVar165._0_8_ =
                                               dVar2 - local_58.m_data[local_58.m_cols * 3 + 2];
                                          auVar170._8_8_ = 0;
                                          auVar170._0_8_ =
                                               (dVar2 - local_58.m_data[local_58.m_cols * 3 + 1]) *
                                               (local_58.m_data[local_58.m_cols + 2] - dVar1);
                                          auVar28 = vfmsub231sd_fma(auVar170,auVar149,auVar165);
                                          auVar96._8_8_ = 0;
                                          auVar96._0_8_ =
                                               dVar1 - local_58.m_data[local_58.m_cols + 3];
                                          auVar127._8_8_ = 0;
                                          auVar127._0_8_ =
                                               (dVar2 - local_58.m_data[local_58.m_cols * 3 + 3]) *
                                               (local_58.m_data[local_58.m_cols + 1] -
                                               local_58.m_data[local_58.m_cols + 3]);
                                          auVar178._8_8_ = 0;
                                          auVar178._0_8_ =
                                               local_58.m_data[local_58.m_cols * 3 + 1] -
                                               local_58.m_data[local_58.m_cols * 3 + 3];
                                          auVar27 = vfmsub231sd_fma(auVar127,auVar96,auVar178);
                                          auVar15._8_8_ = 0;
                                          auVar15._0_8_ = local_38;
                                          auVar97._8_8_ = 0;
                                          auVar97._0_8_ = auVar27._0_8_ * local_20;
                                          auVar28 = vfmadd231sd_fma(auVar97,auVar28,auVar15);
                                          (mmatrB->
                                          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                          ).m_storage.m_data[lVar26 + 0x1c] =
                                               (auVar28._0_8_ * 4.0) / SVar30;
                                          if ((((1 < local_58.m_rows) && (3 < local_58.m_cols)) &&
                                              (local_58.m_rows != 2)) &&
                                             ((2 < (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows &&
                                              (lVar26 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 2 < lVar26)))) {
                                            auVar98._8_8_ = 0;
                                            auVar98._0_8_ =
                                                 (local_58.m_data[local_58.m_cols * 2 + 3] -
                                                 local_58.m_data[local_58.m_cols * 2 + 1]) *
                                                 (local_58.m_data[local_58.m_cols + 2] -
                                                 local_58.m_data[local_58.m_cols + 1]);
                                            auVar128._8_8_ = 0;
                                            auVar128._0_8_ =
                                                 local_58.m_data[local_58.m_cols + 3] -
                                                 local_58.m_data[local_58.m_cols + 1];
                                            auVar157._8_8_ = 0;
                                            auVar157._0_8_ =
                                                 local_58.m_data[local_58.m_cols * 2 + 2] -
                                                 local_58.m_data[local_58.m_cols * 2 + 1];
                                            auVar28 = vfmsub231sd_fma(auVar98,auVar128,auVar157);
                                            (mmatrB->
                                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                            ).m_storage.m_data[lVar26 * 2 + 2] =
                                                 (dVar65 * auVar28._0_8_) / SVar30;
                                            if ((1 < local_58.m_rows) &&
                                               (((2 < local_58.m_cols && (local_58.m_rows != 2)) &&
                                                ((local_58.m_cols != 3 &&
                                                 ((2 < (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows &&
                                                  (lVar26 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 5 < lVar26)))))))) {
                                              auVar66._8_8_ = 0;
                                              auVar66._0_8_ =
                                                   (local_58.m_data[local_58.m_cols * 2] -
                                                   local_58.m_data[local_58.m_cols * 2 + 2]) *
                                                   (local_58.m_data[local_58.m_cols + 2] -
                                                   local_58.m_data[local_58.m_cols + 3]);
                                              auVar99._8_8_ = 0;
                                              auVar99._0_8_ =
                                                   local_58.m_data[local_58.m_cols + 2] -
                                                   local_58.m_data[local_58.m_cols];
                                              auVar129._8_8_ = 0;
                                              auVar129._0_8_ =
                                                   local_58.m_data[local_58.m_cols * 2 + 3] -
                                                   local_58.m_data[local_58.m_cols * 2 + 2];
                                              auVar28 = vfmsub231sd_fma(auVar66,auVar99,auVar129);
                                              (mmatrB->
                                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                              ).m_storage.m_data[lVar26 * 2 + 5] =
                                                   (dVar52 * auVar28._0_8_) / SVar30;
                                              if (((1 < local_58.m_rows) &&
                                                  (((1 < local_58.m_cols && (3 < local_58.m_cols))
                                                   && (local_58.m_rows != 2)))) &&
                                                 ((2 < (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows &&
                                                  (lVar26 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 8 < lVar26)))) {
                                                auVar54._8_8_ = 0;
                                                auVar54._0_8_ =
                                                     local_58.m_data[local_58.m_cols + 1] -
                                                     local_58.m_data[local_58.m_cols + 3];
                                                auVar67._8_8_ = 0;
                                                auVar67._0_8_ =
                                                     (local_58.m_data[local_58.m_cols * 2 + 1] -
                                                     local_58.m_data[local_58.m_cols * 2 + 3]) *
                                                     (local_58.m_data[local_58.m_cols] -
                                                     local_58.m_data[local_58.m_cols + 3]);
                                                auVar130._8_8_ = 0;
                                                auVar130._0_8_ =
                                                     local_58.m_data[local_58.m_cols * 2] -
                                                     local_58.m_data[local_58.m_cols * 2 + 3];
                                                auVar28 = vfmsub231sd_fma(auVar67,auVar54,auVar130);
                                                (mmatrB->
                                                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                ).m_storage.m_data[lVar26 * 2 + 8] =
                                                     (dVar44 * auVar28._0_8_) / SVar30;
                                                if ((((1 < local_58.m_rows) &&
                                                     ((0 < local_58.m_cols && (2 < local_58.m_cols))
                                                     )) && (local_58.m_rows != 2)) &&
                                                   ((2 < (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows &&
                                                  (lVar26 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 0xb < lVar26)))) {
                                                  auVar46._8_8_ = 0;
                                                  auVar46._0_8_ =
                                                       (local_58.m_data[local_58.m_cols * 2 + 2] -
                                                       local_58.m_data[local_58.m_cols * 2]) *
                                                       (local_58.m_data[local_58.m_cols] -
                                                       local_58.m_data[local_58.m_cols + 1]);
                                                  auVar55._8_8_ = 0;
                                                  auVar55._0_8_ =
                                                       local_58.m_data[local_58.m_cols] -
                                                       local_58.m_data[local_58.m_cols + 2];
                                                  auVar100._8_8_ = 0;
                                                  auVar100._0_8_ =
                                                       local_58.m_data[local_58.m_cols * 2 + 1] -
                                                       local_58.m_data[local_58.m_cols * 2];
                                                  auVar28 = vfmsub231sd_fma(auVar46,auVar55,auVar100
                                                                           );
                                                  (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data[lVar26 * 2 + 0xb] =
                                                       (dVar31 * auVar28._0_8_) / SVar30;
                                                  if ((1 < local_58.m_rows) &&
                                                     ((((2 < local_58.m_cols &&
                                                        (local_58.m_rows != 2)) &&
                                                       (local_58.m_cols != 3)) &&
                                                      ((2 < (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows &&
                                                  (lVar26 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 0xe < lVar26)))))) {
                                                    dVar65 = local_58.m_data[local_58.m_cols + 2];
                                                    dVar52 = local_58.m_data
                                                             [local_58.m_cols * 2 + 2];
                                                    auVar56._8_8_ = 0;
                                                    auVar56._0_8_ =
                                                         dVar65 - local_58.m_data[local_58.m_cols];
                                                    auVar131._8_8_ = 0;
                                                    auVar131._0_8_ =
                                                         local_58.m_data[local_58.m_cols * 2 + 3] -
                                                         dVar52;
                                                    auVar158._8_8_ = 0;
                                                    auVar158._0_8_ =
                                                         (local_58.m_data[local_58.m_cols * 2] -
                                                         dVar52) * (dVar65 - local_58.m_data
                                                                             [local_58.m_cols + 3]);
                                                    auVar28 = vfmsub231sd_fma(auVar158,auVar56,
                                                                              auVar131);
                                                    auVar33._8_8_ = 0;
                                                    auVar33._0_8_ =
                                                         (local_58.m_data[local_58.m_cols * 2 + 3] -
                                                         local_58.m_data[local_58.m_cols * 2 + 1]) *
                                                         (dVar65 - local_58.m_data
                                                                   [local_58.m_cols + 1]);
                                                    auVar57._8_8_ = 0;
                                                    auVar57._0_8_ =
                                                         local_58.m_data[local_58.m_cols + 3] -
                                                         local_58.m_data[local_58.m_cols + 1];
                                                    auVar101._8_8_ = 0;
                                                    auVar101._0_8_ =
                                                         dVar52 - local_58.m_data
                                                                  [local_58.m_cols * 2 + 1];
                                                    auVar27 = vfmsub231sd_fma(auVar33,auVar57,
                                                                              auVar101);
                                                    auVar16._8_8_ = 0;
                                                    auVar16._0_8_ = local_28;
                                                    auVar34._8_8_ = 0;
                                                    auVar34._0_8_ = auVar27._0_8_ * local_30;
                                                    auVar28 = vfmadd231sd_fma(auVar34,auVar28,
                                                                              auVar16);
                                                    (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data[lVar26 * 2 + 0xe] =
                                                       (auVar28._0_8_ * 4.0) / SVar30;
                                                  if ((1 < local_58.m_rows) &&
                                                     (((1 < local_58.m_cols && (3 < local_58.m_cols)
                                                       ) && ((local_58.m_rows != 2 &&
                                                             ((2 < (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows &&
                                                  (lVar26 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 0x11 < lVar26)))))))) {
                                                    dVar65 = local_58.m_data[local_58.m_cols + 3];
                                                    dVar52 = local_58.m_data
                                                             [local_58.m_cols * 2 + 3];
                                                    auVar58._8_8_ = 0;
                                                    auVar58._0_8_ =
                                                         local_58.m_data[local_58.m_cols + 1] -
                                                         dVar65;
                                                    auVar102._8_8_ = 0;
                                                    auVar102._0_8_ =
                                                         (local_58.m_data[local_58.m_cols] - dVar65)
                                                         * (local_58.m_data[local_58.m_cols * 2 + 1]
                                                           - dVar52);
                                                    auVar150._8_8_ = 0;
                                                    auVar150._0_8_ =
                                                         local_58.m_data[local_58.m_cols * 2] -
                                                         dVar52;
                                                    auVar28 = vfmsub231sd_fma(auVar102,auVar58,
                                                                              auVar150);
                                                    auVar35._8_8_ = 0;
                                                    auVar35._0_8_ =
                                                         (local_58.m_data[local_58.m_cols * 2] -
                                                         local_58.m_data[local_58.m_cols * 2 + 2]) *
                                                         (local_58.m_data[local_58.m_cols + 2] -
                                                         dVar65);
                                                    auVar47._8_8_ = 0;
                                                    auVar47._0_8_ =
                                                         local_58.m_data[local_58.m_cols + 2] -
                                                         local_58.m_data[local_58.m_cols];
                                                    auVar132._8_8_ = 0;
                                                    auVar132._0_8_ =
                                                         dVar52 - local_58.m_data
                                                                  [local_58.m_cols * 2 + 2];
                                                    auVar27 = vfmsub231sd_fma(auVar35,auVar47,
                                                                              auVar132);
                                                    auVar17._8_8_ = 0;
                                                    auVar17._0_8_ = local_30;
                                                    auVar36._8_8_ = 0;
                                                    auVar36._0_8_ = auVar27._0_8_ * local_38;
                                                    auVar28 = vfmadd231sd_fma(auVar36,auVar28,
                                                                              auVar17);
                                                    (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data[lVar26 * 2 + 0x11] =
                                                       (auVar28._0_8_ * 4.0) / SVar30;
                                                  if ((1 < local_58.m_rows) &&
                                                     ((((3 < local_58.m_cols &&
                                                        (local_58.m_rows != 2)) &&
                                                       (2 < (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows)) &&
                                                  (lVar26 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 0x14 < lVar26)))) {
                                                    dVar65 = local_58.m_data[local_58.m_cols + 3];
                                                    dVar52 = local_58.m_data[local_58.m_cols + 1];
                                                    dVar44 = local_58.m_data
                                                             [local_58.m_cols * 2 + 1];
                                                    dVar31 = local_58.m_data
                                                             [local_58.m_cols * 2 + 3];
                                                    auVar68._8_8_ = 0;
                                                    auVar68._0_8_ = dVar65 - dVar52;
                                                    auVar103._8_8_ = 0;
                                                    auVar103._0_8_ =
                                                         local_58.m_data[local_58.m_cols * 2 + 2] -
                                                         dVar44;
                                                    auVar159._8_8_ = 0;
                                                    auVar159._0_8_ =
                                                         (dVar31 - dVar44) *
                                                         (local_58.m_data[local_58.m_cols + 2] -
                                                         dVar52);
                                                    auVar28 = vfmsub231sd_fma(auVar159,auVar68,
                                                                              auVar103);
                                                    auVar37._8_8_ = 0;
                                                    auVar37._0_8_ =
                                                         (dVar44 - dVar31) *
                                                         (local_58.m_data[local_58.m_cols] - dVar65)
                                                    ;
                                                    auVar59._8_8_ = 0;
                                                    auVar59._0_8_ = dVar52 - dVar65;
                                                    auVar69._8_8_ = 0;
                                                    auVar69._0_8_ =
                                                         local_58.m_data[local_58.m_cols * 2] -
                                                         dVar31;
                                                    auVar27 = vfmsub231sd_fma(auVar37,auVar59,
                                                                              auVar69);
                                                    auVar18._8_8_ = 0;
                                                    auVar18._0_8_ = local_38;
                                                    auVar38._8_8_ = 0;
                                                    auVar38._0_8_ = auVar27._0_8_ * local_28;
                                                    auVar28 = vfmadd231sd_fma(auVar38,auVar28,
                                                                              auVar18);
                                                    (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data[lVar26 * 2 + 0x14] =
                                                       (auVar28._0_8_ * 4.0) / SVar30;
                                                  if ((((1 < local_58.m_rows) &&
                                                       (0 < local_58.m_cols)) &&
                                                      ((2 < local_58.m_cols &&
                                                       ((local_58.m_rows != 2 &&
                                                        (local_58.m_cols != 3)))))) &&
                                                     ((2 < (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows &&
                                                  (lVar26 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 0x17 < lVar26)))) {
                                                    dVar65 = local_58.m_data
                                                             [local_58.m_cols * 2 + 1];
                                                    dVar52 = local_58.m_data[local_58.m_cols + 1];
                                                    auVar39._8_8_ = 0;
                                                    auVar39._0_8_ =
                                                         (local_58.m_data[local_58.m_cols * 2 + 2] -
                                                         local_58.m_data[local_58.m_cols * 2]) *
                                                         (local_58.m_data[local_58.m_cols] - dVar52)
                                                    ;
                                                    auVar60._8_8_ = 0;
                                                    auVar60._0_8_ =
                                                         local_58.m_data[local_58.m_cols] -
                                                         local_58.m_data[local_58.m_cols + 2];
                                                    auVar133._8_8_ = 0;
                                                    auVar133._0_8_ =
                                                         dVar65 - local_58.m_data
                                                                  [local_58.m_cols * 2];
                                                    auVar28 = vfmsub231sd_fma(auVar39,auVar60,
                                                                              auVar133);
                                                    auVar48._8_8_ = 0;
                                                    auVar48._0_8_ =
                                                         (local_58.m_data[local_58.m_cols * 2 + 3] -
                                                         dVar65) * (local_58.m_data
                                                                    [local_58.m_cols + 2] - dVar52);
                                                    auVar61._8_8_ = 0;
                                                    auVar61._0_8_ =
                                                         local_58.m_data[local_58.m_cols + 3] -
                                                         dVar52;
                                                    auVar70._8_8_ = 0;
                                                    auVar70._0_8_ =
                                                         local_58.m_data[local_58.m_cols * 2 + 2] -
                                                         dVar65;
                                                    auVar27 = vfmsub231sd_fma(auVar48,auVar61,
                                                                              auVar70);
                                                    auVar19._8_8_ = 0;
                                                    auVar19._0_8_ = local_28;
                                                    auVar49._8_8_ = 0;
                                                    auVar49._0_8_ = local_20 * auVar27._0_8_;
                                                    auVar28 = vfmadd231sd_fma(auVar49,auVar28,
                                                                              auVar19);
                                                    (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data[lVar26 * 2 + 0x17] =
                                                       (auVar28._0_8_ * 4.0) / SVar30;
                                                  if ((((1 < local_58.m_rows) &&
                                                       (0 < local_58.m_cols)) &&
                                                      (2 < local_58.m_cols)) &&
                                                     (((local_58.m_rows != 2 &&
                                                       (local_58.m_cols != 3)) &&
                                                      ((2 < (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows &&
                                                  (lVar26 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 0x1a < lVar26)))))) {
                                                    dVar65 = local_58.m_data[local_58.m_cols];
                                                    dVar52 = local_58.m_data[local_58.m_cols + 2];
                                                    dVar44 = local_58.m_data[local_58.m_cols * 2];
                                                    dVar31 = local_58.m_data
                                                             [local_58.m_cols * 2 + 2];
                                                    auVar62._8_8_ = 0;
                                                    auVar62._0_8_ = dVar65 - dVar52;
                                                    auVar104._8_8_ = 0;
                                                    auVar104._0_8_ =
                                                         local_58.m_data[local_58.m_cols * 2 + 1] -
                                                         dVar44;
                                                    auVar134._8_8_ = 0;
                                                    auVar134._0_8_ =
                                                         (dVar31 - dVar44) *
                                                         (dVar65 - local_58.m_data
                                                                   [local_58.m_cols + 1]);
                                                    auVar28 = vfmsub231sd_fma(auVar134,auVar62,
                                                                              auVar104);
                                                    auVar40._8_8_ = 0;
                                                    auVar40._0_8_ = dVar52 - dVar65;
                                                    auVar50._8_8_ = 0;
                                                    auVar50._0_8_ =
                                                         (dVar44 - dVar31) *
                                                         (dVar52 - local_58.m_data
                                                                   [local_58.m_cols + 3]);
                                                    auVar63._8_8_ = 0;
                                                    auVar63._0_8_ =
                                                         local_58.m_data[local_58.m_cols * 2 + 3] -
                                                         dVar31;
                                                    auVar27 = vfmsub231sd_fma(auVar50,auVar40,
                                                                              auVar63);
                                                    auVar20._8_8_ = 0;
                                                    auVar20._0_8_ = local_30;
                                                    auVar41._8_8_ = 0;
                                                    auVar41._0_8_ = local_20 * auVar27._0_8_;
                                                    auVar28 = vfmadd231sd_fma(auVar41,auVar28,
                                                                              auVar20);
                                                    (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data[lVar26 * 2 + 0x1a] =
                                                       (auVar28._0_8_ * 4.0) / SVar30;
                                                  if ((((1 < local_58.m_rows) &&
                                                       (0 < local_58.m_cols)) &&
                                                      (2 < local_58.m_cols)) &&
                                                     ((((local_58.m_rows != 2 &&
                                                        (local_58.m_cols != 3)) &&
                                                       (2 < (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows)) &&
                                                  (lVar26 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 0x1d < lVar26)))) {
                                                    dVar65 = local_58.m_data[local_58.m_cols];
                                                    dVar52 = local_58.m_data[local_58.m_cols * 2];
                                                    auVar51._8_8_ = 0;
                                                    auVar51._0_8_ =
                                                         dVar65 - local_58.m_data
                                                                  [local_58.m_cols + 2];
                                                    auVar105._8_8_ = 0;
                                                    auVar105._0_8_ =
                                                         local_58.m_data[local_58.m_cols * 2 + 1] -
                                                         dVar52;
                                                    auVar151._8_8_ = 0;
                                                    auVar151._0_8_ =
                                                         (local_58.m_data[local_58.m_cols * 2 + 2] -
                                                         dVar52) * (dVar65 - local_58.m_data
                                                                             [local_58.m_cols + 1]);
                                                    auVar28 = vfmsub231sd_fma(auVar151,auVar51,
                                                                              auVar105);
                                                    auVar42._8_8_ = 0;
                                                    auVar42._0_8_ =
                                                         (local_58.m_data[local_58.m_cols * 2 + 1] -
                                                         local_58.m_data[local_58.m_cols * 2 + 3]) *
                                                         (dVar65 - local_58.m_data
                                                                   [local_58.m_cols + 3]);
                                                    auVar64._8_8_ = 0;
                                                    auVar64._0_8_ =
                                                         dVar52 - local_58.m_data
                                                                  [local_58.m_cols * 2 + 3];
                                                    auVar106._8_8_ = 0;
                                                    auVar106._0_8_ =
                                                         local_58.m_data[local_58.m_cols + 1] -
                                                         local_58.m_data[local_58.m_cols + 3];
                                                    auVar27 = vfmsub231sd_fma(auVar42,auVar106,
                                                                              auVar64);
                                                    auVar21._8_8_ = 0;
                                                    auVar21._0_8_ = local_38;
                                                    auVar43._8_8_ = 0;
                                                    auVar43._0_8_ = local_20 * auVar27._0_8_;
                                                    auVar28 = vfmadd231sd_fma(auVar43,auVar28,
                                                                              auVar21);
                                                    (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data[lVar26 * 2 + 0x1d] =
                                                       (auVar28._0_8_ * 4.0) / SVar30;
                                                  lVar26 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows;
                                                  if (((1 < lVar26) &&
                                                      (lVar22 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 1 < lVar22)) && (3 < lVar26))
                                                  {
                                                    pdVar23 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data;
                                                  pdVar23[lVar22 * 3] = pdVar23[lVar22 + 1];
                                                  lVar26 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows;
                                                  if (((0 < lVar26) &&
                                                      (lVar22 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 0 < lVar22)) &&
                                                  ((3 < lVar26 && (lVar22 != 1)))) {
                                                    pdVar23 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data;
                                                  pdVar23[lVar22 * 3 + 1] = *pdVar23;
                                                  lVar26 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows;
                                                  if (((1 < lVar26) &&
                                                      (lVar22 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 4 < lVar22)) && (3 < lVar26))
                                                  {
                                                    pdVar23 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data;
                                                  pdVar23[lVar22 * 3 + 3] = pdVar23[lVar22 + 4];
                                                  lVar26 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows;
                                                  if (((0 < lVar26) &&
                                                      (lVar22 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 3 < lVar22)) &&
                                                  ((3 < lVar26 && (lVar22 != 4)))) {
                                                    pdVar23 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data;
                                                  pdVar23[lVar22 * 3 + 4] = pdVar23[3];
                                                  lVar26 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows;
                                                  if (((1 < lVar26) &&
                                                      (lVar22 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 7 < lVar22)) && (3 < lVar26))
                                                  {
                                                    pdVar23 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data;
                                                  pdVar23[lVar22 * 3 + 6] = pdVar23[lVar22 + 7];
                                                  lVar26 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows;
                                                  if ((((0 < lVar26) &&
                                                       (lVar22 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 6 < lVar22)) && (3 < lVar26))
                                                  && (lVar22 != 7)) {
                                                    pdVar23 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data;
                                                  pdVar23[lVar22 * 3 + 7] = pdVar23[6];
                                                  lVar26 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows;
                                                  if (((1 < lVar26) &&
                                                      (lVar22 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 10 < lVar22)) && (3 < lVar26))
                                                  {
                                                    pdVar23 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data;
                                                  pdVar23[lVar22 * 3 + 9] = pdVar23[lVar22 + 10];
                                                  lVar26 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows;
                                                  if (((0 < lVar26) &&
                                                      (lVar22 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 9 < lVar22)) &&
                                                  ((3 < lVar26 && (lVar22 != 10)))) {
                                                    pdVar23 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data;
                                                  pdVar23[lVar22 * 3 + 10] = pdVar23[9];
                                                  lVar26 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows;
                                                  if (((1 < lVar26) &&
                                                      (lVar22 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 0xd < lVar22)) && (3 < lVar26)
                                                  ) {
                                                    pdVar23 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data;
                                                  pdVar23[lVar22 * 3 + 0xc] = pdVar23[lVar22 + 0xd];
                                                  lVar26 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows;
                                                  if ((((0 < lVar26) &&
                                                       (lVar22 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 0xc < lVar22)) && (3 < lVar26)
                                                  ) && (lVar22 != 0xd)) {
                                                    pdVar23 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data;
                                                  pdVar23[lVar22 * 3 + 0xd] = pdVar23[0xc];
                                                  lVar26 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows;
                                                  if (((1 < lVar26) &&
                                                      (lVar22 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 0x10 < lVar22)) &&
                                                  (3 < lVar26)) {
                                                    pdVar23 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data;
                                                  pdVar23[lVar22 * 3 + 0xf] = pdVar23[lVar22 + 0x10]
                                                  ;
                                                  lVar26 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows;
                                                  if ((((0 < lVar26) &&
                                                       (lVar22 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 0xf < lVar22)) && (3 < lVar26)
                                                  ) && (lVar22 != 0x10)) {
                                                    pdVar23 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data;
                                                  pdVar23[lVar22 * 3 + 0x10] = pdVar23[0xf];
                                                  lVar26 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows;
                                                  if (((1 < lVar26) &&
                                                      (lVar22 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 0x13 < lVar22)) &&
                                                  (3 < lVar26)) {
                                                    pdVar23 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data;
                                                  pdVar23[lVar22 * 3 + 0x12] =
                                                       pdVar23[lVar22 + 0x13];
                                                  lVar26 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows;
                                                  if (((0 < lVar26) &&
                                                      (lVar22 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 0x12 < lVar22)) &&
                                                  ((3 < lVar26 && (lVar22 != 0x13)))) {
                                                    pdVar23 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data;
                                                  pdVar23[lVar22 * 3 + 0x13] = pdVar23[0x12];
                                                  lVar26 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows;
                                                  if (((1 < lVar26) &&
                                                      (lVar22 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 0x16 < lVar22)) &&
                                                  (3 < lVar26)) {
                                                    pdVar23 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data;
                                                  pdVar23[lVar22 * 3 + 0x15] =
                                                       pdVar23[lVar22 + 0x16];
                                                  lVar26 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows;
                                                  if (((0 < lVar26) &&
                                                      (lVar22 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 0x15 < lVar22)) &&
                                                  ((3 < lVar26 && (lVar22 != 0x16)))) {
                                                    pdVar23 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data;
                                                  pdVar23[lVar22 * 3 + 0x16] = pdVar23[0x15];
                                                  lVar26 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows;
                                                  if (((1 < lVar26) &&
                                                      (lVar22 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 0x19 < lVar22)) &&
                                                  (3 < lVar26)) {
                                                    pdVar23 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data;
                                                  pdVar23[lVar22 * 3 + 0x18] =
                                                       pdVar23[lVar22 + 0x19];
                                                  lVar26 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows;
                                                  if ((((0 < lVar26) &&
                                                       (lVar22 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 0x18 < lVar22)) &&
                                                  (3 < lVar26)) && (lVar22 != 0x19)) {
                                                    pdVar23 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data;
                                                  pdVar23[lVar22 * 3 + 0x19] = pdVar23[0x18];
                                                  lVar26 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows;
                                                  if (((1 < lVar26) &&
                                                      (lVar22 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 0x1c < lVar22)) &&
                                                  (3 < lVar26)) {
                                                    pdVar23 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data;
                                                  pdVar23[lVar22 * 3 + 0x1b] =
                                                       pdVar23[lVar22 + 0x1c];
                                                  lVar26 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows;
                                                  if (((0 < lVar26) &&
                                                      (lVar22 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 0x1b < lVar22)) &&
                                                  ((3 < lVar26 && (lVar22 != 0x1c)))) {
                                                    pdVar23 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data;
                                                  pdVar23[lVar22 * 3 + 0x1c] = pdVar23[0x1b];
                                                  lVar26 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows;
                                                  if (((2 < lVar26) &&
                                                      (lVar22 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 2 < lVar22)) && (4 < lVar26))
                                                  {
                                                    pdVar23 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data;
                                                  pdVar23[lVar22 * 4 + 1] = pdVar23[lVar22 * 2 + 2];
                                                  lVar26 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows;
                                                  if ((((1 < lVar26) &&
                                                       (lVar22 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 1 < lVar22)) && (4 < lVar26))
                                                  && (lVar22 != 2)) {
                                                    pdVar23 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data;
                                                  pdVar23[lVar22 * 4 + 2] = pdVar23[lVar22 + 1];
                                                  lVar26 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows;
                                                  if (((2 < lVar26) &&
                                                      (lVar22 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 5 < lVar22)) && (4 < lVar26))
                                                  {
                                                    pdVar23 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data;
                                                  pdVar23[lVar22 * 4 + 4] = pdVar23[lVar22 * 2 + 5];
                                                  lVar26 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows;
                                                  if ((((1 < lVar26) &&
                                                       (lVar22 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 4 < lVar22)) && (4 < lVar26))
                                                  && (lVar22 != 5)) {
                                                    pdVar23 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data;
                                                  pdVar23[lVar22 * 4 + 5] = pdVar23[lVar22 + 4];
                                                  lVar26 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows;
                                                  if (((2 < lVar26) &&
                                                      (lVar22 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 8 < lVar22)) && (4 < lVar26))
                                                  {
                                                    pdVar23 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data;
                                                  pdVar23[lVar22 * 4 + 7] = pdVar23[lVar22 * 2 + 8];
                                                  lVar26 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows;
                                                  if (((1 < lVar26) &&
                                                      (lVar22 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 7 < lVar22)) &&
                                                  ((4 < lVar26 && (lVar22 != 8)))) {
                                                    pdVar23 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data;
                                                  pdVar23[lVar22 * 4 + 8] = pdVar23[lVar22 + 7];
                                                  lVar26 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows;
                                                  if (((2 < lVar26) &&
                                                      (lVar22 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 0xb < lVar22)) && (4 < lVar26)
                                                  ) {
                                                    pdVar23 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data;
                                                  pdVar23[lVar22 * 4 + 10] =
                                                       pdVar23[lVar22 * 2 + 0xb];
                                                  lVar26 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows;
                                                  if (((1 < lVar26) &&
                                                      (lVar22 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 10 < lVar22)) &&
                                                  ((4 < lVar26 && (lVar22 != 0xb)))) {
                                                    pdVar23 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data;
                                                  pdVar23[lVar22 * 4 + 0xb] = pdVar23[lVar22 + 10];
                                                  lVar26 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows;
                                                  if (((2 < lVar26) &&
                                                      (lVar22 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 0xe < lVar22)) && (4 < lVar26)
                                                  ) {
                                                    pdVar23 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data;
                                                  pdVar23[lVar22 * 4 + 0xd] =
                                                       pdVar23[lVar22 * 2 + 0xe];
                                                  lVar26 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows;
                                                  if ((((1 < lVar26) &&
                                                       (lVar22 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 0xd < lVar22)) && (4 < lVar26)
                                                  ) && (lVar22 != 0xe)) {
                                                    pdVar23 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data;
                                                  pdVar23[lVar22 * 4 + 0xe] = pdVar23[lVar22 + 0xd];
                                                  lVar26 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows;
                                                  if (((2 < lVar26) &&
                                                      (lVar22 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 0x11 < lVar22)) &&
                                                  (4 < lVar26)) {
                                                    pdVar23 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data;
                                                  pdVar23[lVar22 * 4 + 0x10] =
                                                       pdVar23[lVar22 * 2 + 0x11];
                                                  lVar26 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows;
                                                  if (((1 < lVar26) &&
                                                      (lVar22 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 0x10 < lVar22)) &&
                                                  ((4 < lVar26 && (lVar22 != 0x11)))) {
                                                    pdVar23 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data;
                                                  pdVar23[lVar22 * 4 + 0x11] =
                                                       pdVar23[lVar22 + 0x10];
                                                  lVar26 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows;
                                                  if (((2 < lVar26) &&
                                                      (lVar22 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 0x14 < lVar22)) &&
                                                  (4 < lVar26)) {
                                                    pdVar23 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data;
                                                  pdVar23[lVar22 * 4 + 0x13] =
                                                       pdVar23[lVar22 * 2 + 0x14];
                                                  lVar26 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows;
                                                  if ((((1 < lVar26) &&
                                                       (lVar22 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 0x13 < lVar22)) &&
                                                  (4 < lVar26)) && (lVar22 != 0x14)) {
                                                    pdVar23 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data;
                                                  pdVar23[lVar22 * 4 + 0x14] =
                                                       pdVar23[lVar22 + 0x13];
                                                  lVar26 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows;
                                                  if (((2 < lVar26) &&
                                                      (lVar22 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 0x17 < lVar22)) &&
                                                  (4 < lVar26)) {
                                                    pdVar23 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data;
                                                  pdVar23[lVar22 * 4 + 0x16] =
                                                       pdVar23[lVar22 * 2 + 0x17];
                                                  lVar26 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows;
                                                  if ((((1 < lVar26) &&
                                                       (lVar22 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 0x16 < lVar22)) &&
                                                  (4 < lVar26)) && (lVar22 != 0x17)) {
                                                    pdVar23 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data;
                                                  pdVar23[lVar22 * 4 + 0x17] =
                                                       pdVar23[lVar22 + 0x16];
                                                  lVar26 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows;
                                                  if (((2 < lVar26) &&
                                                      (lVar22 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 0x1a < lVar22)) &&
                                                  (4 < lVar26)) {
                                                    pdVar23 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data;
                                                  pdVar23[lVar22 * 4 + 0x19] =
                                                       pdVar23[lVar22 * 2 + 0x1a];
                                                  lVar26 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows;
                                                  if (((1 < lVar26) &&
                                                      (lVar22 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 0x19 < lVar22)) &&
                                                  ((4 < lVar26 && (lVar22 != 0x1a)))) {
                                                    pdVar23 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data;
                                                  pdVar23[lVar22 * 4 + 0x1a] =
                                                       pdVar23[lVar22 + 0x19];
                                                  lVar26 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows;
                                                  if (((2 < lVar26) &&
                                                      (lVar22 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 0x1d < lVar22)) &&
                                                  (4 < lVar26)) {
                                                    pdVar23 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data;
                                                  pdVar23[lVar22 * 4 + 0x1c] =
                                                       pdVar23[lVar22 * 2 + 0x1d];
                                                  lVar26 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows;
                                                  if (((1 < lVar26) &&
                                                      (lVar22 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 0x1c < lVar22)) &&
                                                  ((4 < lVar26 && (lVar22 != 0x1d)))) {
                                                    pdVar23 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data;
                                                  pdVar23[lVar22 * 4 + 0x1d] =
                                                       pdVar23[lVar22 + 0x1c];
                                                  lVar26 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows;
                                                  if (((2 < lVar26) &&
                                                      (lVar22 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 2 < lVar22)) && (5 < lVar26))
                                                  {
                                                    pdVar23 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data;
                                                  pdVar23[lVar22 * 5] = pdVar23[lVar22 * 2 + 2];
                                                  lVar26 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows;
                                                  if ((((0 < lVar26) &&
                                                       (lVar22 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 0 < lVar22)) && (5 < lVar26))
                                                  && (2 < lVar22)) {
                                                    pdVar23 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data;
                                                  pdVar23[lVar22 * 5 + 2] = *pdVar23;
                                                  lVar26 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows;
                                                  if (((2 < lVar26) &&
                                                      (lVar22 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 5 < lVar22)) && (5 < lVar26))
                                                  {
                                                    pdVar23 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data;
                                                  pdVar23[lVar22 * 5 + 3] = pdVar23[lVar22 * 2 + 5];
                                                  lVar26 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows;
                                                  if (((0 < lVar26) &&
                                                      (lVar22 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 3 < lVar22)) &&
                                                  ((5 < lVar26 && (5 < lVar22)))) {
                                                    pdVar23 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data;
                                                  pdVar23[lVar22 * 5 + 5] = pdVar23[3];
                                                  lVar26 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows;
                                                  if (((2 < lVar26) &&
                                                      (lVar22 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 8 < lVar22)) && (5 < lVar26))
                                                  {
                                                    pdVar23 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data;
                                                  pdVar23[lVar22 * 5 + 6] = pdVar23[lVar22 * 2 + 8];
                                                  lVar26 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows;
                                                  if ((((0 < lVar26) &&
                                                       (lVar22 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 6 < lVar22)) && (5 < lVar26))
                                                  && (8 < lVar22)) {
                                                    pdVar23 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data;
                                                  pdVar23[lVar22 * 5 + 8] = pdVar23[6];
                                                  lVar26 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows;
                                                  if (((2 < lVar26) &&
                                                      (lVar22 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 0xb < lVar22)) && (5 < lVar26)
                                                  ) {
                                                    pdVar23 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data;
                                                  pdVar23[lVar22 * 5 + 9] =
                                                       pdVar23[lVar22 * 2 + 0xb];
                                                  lVar26 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows;
                                                  if ((((0 < lVar26) &&
                                                       (lVar22 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 9 < lVar22)) && (5 < lVar26))
                                                  && (0xb < lVar22)) {
                                                    pdVar23 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data;
                                                  pdVar23[lVar22 * 5 + 0xb] = pdVar23[9];
                                                  lVar26 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows;
                                                  if (((2 < lVar26) &&
                                                      (lVar22 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 0xe < lVar22)) && (5 < lVar26)
                                                  ) {
                                                    pdVar23 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data;
                                                  pdVar23[lVar22 * 5 + 0xc] =
                                                       pdVar23[lVar22 * 2 + 0xe];
                                                  lVar26 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows;
                                                  if (((0 < lVar26) &&
                                                      (lVar22 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 0xc < lVar22)) &&
                                                  ((5 < lVar26 && (0xe < lVar22)))) {
                                                    pdVar23 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data;
                                                  pdVar23[lVar22 * 5 + 0xe] = pdVar23[0xc];
                                                  lVar26 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows;
                                                  if (((2 < lVar26) &&
                                                      (lVar22 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 0x11 < lVar22)) &&
                                                  (5 < lVar26)) {
                                                    pdVar23 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data;
                                                  pdVar23[lVar22 * 5 + 0xf] =
                                                       pdVar23[lVar22 * 2 + 0x11];
                                                  lVar26 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows;
                                                  if (((0 < lVar26) &&
                                                      (lVar22 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 0xf < lVar22)) &&
                                                  ((5 < lVar26 && (0x11 < lVar22)))) {
                                                    pdVar23 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data;
                                                  pdVar23[lVar22 * 5 + 0x11] = pdVar23[0xf];
                                                  lVar26 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows;
                                                  if (((2 < lVar26) &&
                                                      (lVar22 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 0x14 < lVar22)) &&
                                                  (5 < lVar26)) {
                                                    pdVar23 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data;
                                                  pdVar23[lVar22 * 5 + 0x12] =
                                                       pdVar23[lVar22 * 2 + 0x14];
                                                  lVar26 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows;
                                                  if ((((0 < lVar26) &&
                                                       (lVar22 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 0x12 < lVar22)) &&
                                                  (5 < lVar26)) && (0x14 < lVar22)) {
                                                    pdVar23 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data;
                                                  pdVar23[lVar22 * 5 + 0x14] = pdVar23[0x12];
                                                  lVar26 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows;
                                                  if (((2 < lVar26) &&
                                                      (lVar22 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 0x17 < lVar22)) &&
                                                  (5 < lVar26)) {
                                                    pdVar23 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data;
                                                  pdVar23[lVar22 * 5 + 0x15] =
                                                       pdVar23[lVar22 * 2 + 0x17];
                                                  lVar26 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows;
                                                  if (((0 < lVar26) &&
                                                      (lVar22 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 0x15 < lVar22)) &&
                                                  ((5 < lVar26 && (0x17 < lVar22)))) {
                                                    pdVar23 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data;
                                                  pdVar23[lVar22 * 5 + 0x17] = pdVar23[0x15];
                                                  lVar26 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows;
                                                  if (((2 < lVar26) &&
                                                      (lVar22 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 0x1a < lVar22)) &&
                                                  (5 < lVar26)) {
                                                    pdVar23 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data;
                                                  pdVar23[lVar22 * 5 + 0x18] =
                                                       pdVar23[lVar22 * 2 + 0x1a];
                                                  lVar26 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows;
                                                  if ((((0 < lVar26) &&
                                                       (lVar22 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 0x18 < lVar22)) &&
                                                  (5 < lVar26)) && (0x1a < lVar22)) {
                                                    pdVar23 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data;
                                                  pdVar23[lVar22 * 5 + 0x1a] = pdVar23[0x18];
                                                  lVar26 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows;
                                                  if (((2 < lVar26) &&
                                                      (lVar22 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 0x1d < lVar22)) &&
                                                  (5 < lVar26)) {
                                                    pdVar23 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data;
                                                  pdVar23[lVar22 * 5 + 0x1b] =
                                                       pdVar23[lVar22 * 2 + 0x1d];
                                                  lVar26 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows;
                                                  if ((((0 < lVar26) &&
                                                       (lVar22 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 0x1b < lVar22)) &&
                                                  (5 < lVar26)) && (0x1d < lVar22)) {
                                                    pdVar23 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data;
                                                  pdVar23[lVar22 * 5 + 0x1d] = pdVar23[0x1b];
                                                  uVar25 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows;
                                                  uVar24 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols;
                                                  if (-1 < (long)(uVar24 | uVar25)) {
                                                    pdVar23 = (mmatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data;
                                                  uVar24 = uVar24 * uVar25;
                                                  uVar25 = uVar24 + 7;
                                                  if (-1 < (long)uVar24) {
                                                    uVar25 = uVar24;
                                                  }
                                                  uVar25 = uVar25 & 0xfffffffffffffff8;
                                                  if (7 < (long)uVar24) {
                                                    lVar26 = 0;
                                                    do {
                                                      auVar29 = vaddpd_avx512f(*(undefined1 (*) [64]
                                                                                )(pdVar23 + lVar26),
                                                                               *(undefined1 (*) [64]
                                                                                )(pdVar23 + lVar26))
                                                      ;
                                                      *(undefined1 (*) [64])(pdVar23 + lVar26) =
                                                           auVar29;
                                                      lVar26 = lVar26 + 8;
                                                    } while (lVar26 < (long)uVar25);
                                                  }
                                                  if ((long)uVar25 < (long)uVar24) {
                                                    do {
                                                      pdVar23[uVar25] =
                                                           pdVar23[uVar25] + pdVar23[uVar25];
                                                      uVar25 = uVar25 + 1;
                                                    } while (uVar24 - uVar25 != 0);
                                                  }
                                                  if (local_58.m_data != (double *)0x0) {
                                                    free((void *)local_58.m_data[-1]);
                                                  }
                                                  return;
                                                  }
                                                  __assert_fail(
                                                  "rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                                                  ,
                                                  "/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h"
                                                  ,0x4a,
                                                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1, 1>]"
                                                  );
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1, 1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>, Level = 1]"
               );
}

Assistant:

void ChElementTetraCorot_10::ComputeMatrB(ChMatrixDynamic<>& mmatrB,
                                          double zeta1,
                                          double zeta2,
                                          double zeta3,
                                          double zeta4,
                                          double& JacobianDet) {
    ChMatrixDynamic<> Jacobian(4, 4);
    ComputeJacobian(Jacobian, zeta1, zeta2, zeta3, zeta4);

    double Jdet = Jacobian.determinant();
    JacobianDet = Jdet;  // !!! store the Jacobian Determinant: needed for the integration

    mmatrB(0, 0) = (4 * zeta1 - 1) *
                   ((Jacobian(2, 3) - Jacobian(2, 1)) * (Jacobian(3, 2) - Jacobian(3, 1)) -
                    (Jacobian(2, 2) - Jacobian(2, 1)) * (Jacobian(3, 3) - Jacobian(3, 1))) /
                   Jdet;
    mmatrB(0, 3) = (4 * zeta2 - 1) *
                   ((Jacobian(2, 2) - Jacobian(2, 0)) * (Jacobian(3, 3) - Jacobian(3, 2)) -
                    (Jacobian(2, 2) - Jacobian(2, 3)) * (Jacobian(3, 0) - Jacobian(3, 2))) /
                   Jdet;
    mmatrB(0, 6) = (4 * zeta3 - 1) *
                   ((Jacobian(2, 1) - Jacobian(2, 3)) * (Jacobian(3, 0) - Jacobian(3, 3)) -
                    (Jacobian(2, 0) - Jacobian(2, 3)) * (Jacobian(3, 1) - Jacobian(3, 3))) /
                   Jdet;
    mmatrB(0, 9) = (4 * zeta4 - 1) *
                   ((Jacobian(2, 0) - Jacobian(2, 2)) * (Jacobian(3, 1) - Jacobian(3, 0)) -
                    (Jacobian(2, 0) - Jacobian(2, 1)) * (Jacobian(3, 2) - Jacobian(3, 0))) /
                   Jdet;
    mmatrB(0, 12) = 4 *
                    (zeta1 * ((Jacobian(2, 2) - Jacobian(2, 0)) * (Jacobian(3, 3) - Jacobian(3, 2)) -
                              (Jacobian(2, 2) - Jacobian(2, 3)) * (Jacobian(3, 0) - Jacobian(3, 2))) +
                     zeta2 * ((Jacobian(2, 3) - Jacobian(2, 1)) * (Jacobian(3, 2) - Jacobian(3, 1)) -
                              (Jacobian(2, 2) - Jacobian(2, 1)) * (Jacobian(3, 3) - Jacobian(3, 1)))) /
                    Jdet;
    mmatrB(0, 15) = 4 *
                    (zeta2 * ((Jacobian(2, 1) - Jacobian(2, 3)) * (Jacobian(3, 0) - Jacobian(3, 3)) -
                              (Jacobian(2, 0) - Jacobian(2, 3)) * (Jacobian(3, 1) - Jacobian(3, 3))) +
                     zeta3 * ((Jacobian(2, 2) - Jacobian(2, 0)) * (Jacobian(3, 3) - Jacobian(3, 2)) -
                              (Jacobian(2, 2) - Jacobian(2, 3)) * (Jacobian(3, 0) - Jacobian(3, 2)))) /
                    Jdet;
    mmatrB(0, 18) = 4 *
                    (zeta3 * ((Jacobian(2, 3) - Jacobian(2, 1)) * (Jacobian(3, 2) - Jacobian(3, 1)) -
                              (Jacobian(2, 2) - Jacobian(2, 1)) * (Jacobian(3, 3) - Jacobian(3, 1))) +
                     zeta1 * ((Jacobian(2, 1) - Jacobian(2, 3)) * (Jacobian(3, 0) - Jacobian(3, 3)) -
                              (Jacobian(2, 0) - Jacobian(2, 3)) * (Jacobian(3, 1) - Jacobian(3, 3)))) /
                    Jdet;
    mmatrB(0, 21) = 4 *
                    (zeta1 * ((Jacobian(2, 0) - Jacobian(2, 2)) * (Jacobian(3, 1) - Jacobian(3, 0)) -
                              (Jacobian(2, 0) - Jacobian(2, 1)) * (Jacobian(3, 2) - Jacobian(3, 0))) +
                     zeta4 * ((Jacobian(2, 3) - Jacobian(2, 1)) * (Jacobian(3, 2) - Jacobian(3, 1)) -
                              (Jacobian(2, 2) - Jacobian(2, 1)) * (Jacobian(3, 3) - Jacobian(3, 1)))) /
                    Jdet;
    mmatrB(0, 24) = 4 *
                    (zeta2 * ((Jacobian(2, 0) - Jacobian(2, 2)) * (Jacobian(3, 1) - Jacobian(3, 0)) -
                              (Jacobian(2, 0) - Jacobian(2, 1)) * (Jacobian(3, 2) - Jacobian(3, 0))) +
                     zeta4 * ((Jacobian(2, 2) - Jacobian(2, 0)) * (Jacobian(3, 3) - Jacobian(3, 2)) -
                              (Jacobian(2, 2) - Jacobian(2, 3)) * (Jacobian(3, 0) - Jacobian(3, 2)))) /
                    Jdet;
    mmatrB(0, 27) = 4 *
                    (zeta3 * ((Jacobian(2, 0) - Jacobian(2, 2)) * (Jacobian(3, 1) - Jacobian(3, 0)) -
                              (Jacobian(2, 0) - Jacobian(2, 1)) * (Jacobian(3, 2) - Jacobian(3, 0))) +
                     zeta4 * ((Jacobian(2, 1) - Jacobian(2, 3)) * (Jacobian(3, 0) - Jacobian(3, 3)) -
                              (Jacobian(2, 0) - Jacobian(2, 3)) * (Jacobian(3, 1) - Jacobian(3, 3)))) /
                    Jdet;

    mmatrB(1, 1) = (4 * zeta1 - 1) *
                   ((Jacobian(1, 2) - Jacobian(1, 1)) * (Jacobian(3, 3) - Jacobian(3, 1)) -
                    (Jacobian(1, 3) - Jacobian(1, 1)) * (Jacobian(3, 2) - Jacobian(3, 1))) /
                   Jdet;
    mmatrB(1, 4) = (4 * zeta2 - 1) *
                   ((Jacobian(1, 3) - Jacobian(1, 2)) * (Jacobian(3, 2) - Jacobian(3, 0)) -
                    (Jacobian(1, 0) - Jacobian(1, 2)) * (Jacobian(3, 2) - Jacobian(3, 3))) /
                   Jdet;
    mmatrB(1, 7) = (4 * zeta3 - 1) *
                   ((Jacobian(1, 0) - Jacobian(1, 3)) * (Jacobian(3, 1) - Jacobian(3, 3)) -
                    (Jacobian(1, 1) - Jacobian(1, 3)) * (Jacobian(3, 0) - Jacobian(3, 3))) /
                   Jdet;
    mmatrB(1, 10) = (4 * zeta4 - 1) *
                    ((Jacobian(1, 1) - Jacobian(1, 0)) * (Jacobian(3, 0) - Jacobian(3, 2)) -
                     (Jacobian(1, 2) - Jacobian(1, 0)) * (Jacobian(3, 0) - Jacobian(3, 1))) /
                    Jdet;
    mmatrB(1, 13) = 4 *
                    (zeta1 * ((Jacobian(1, 3) - Jacobian(1, 2)) * (Jacobian(3, 2) - Jacobian(3, 0)) -
                              (Jacobian(1, 0) - Jacobian(1, 2)) * (Jacobian(3, 2) - Jacobian(3, 3))) +
                     zeta2 * ((Jacobian(1, 2) - Jacobian(1, 1)) * (Jacobian(3, 3) - Jacobian(3, 1)) -
                              (Jacobian(1, 3) - Jacobian(1, 1)) * (Jacobian(3, 2) - Jacobian(3, 1)))) /
                    Jdet;
    mmatrB(1, 16) = 4 *
                    (zeta2 * ((Jacobian(1, 0) - Jacobian(1, 3)) * (Jacobian(3, 1) - Jacobian(3, 3)) -
                              (Jacobian(1, 1) - Jacobian(1, 3)) * (Jacobian(3, 0) - Jacobian(3, 3))) +
                     zeta3 * ((Jacobian(1, 3) - Jacobian(1, 2)) * (Jacobian(3, 2) - Jacobian(3, 0)) -
                              (Jacobian(1, 0) - Jacobian(1, 2)) * (Jacobian(3, 2) - Jacobian(3, 3)))) /
                    Jdet;
    mmatrB(1, 19) = 4 *
                    (zeta3 * ((Jacobian(1, 2) - Jacobian(1, 1)) * (Jacobian(3, 3) - Jacobian(3, 1)) -
                              (Jacobian(1, 3) - Jacobian(1, 1)) * (Jacobian(3, 2) - Jacobian(3, 1))) +
                     zeta1 * ((Jacobian(1, 0) - Jacobian(1, 3)) * (Jacobian(3, 1) - Jacobian(3, 3)) -
                              (Jacobian(1, 1) - Jacobian(1, 3)) * (Jacobian(3, 0) - Jacobian(3, 3)))) /
                    Jdet;
    mmatrB(1, 22) = 4 *
                    (zeta1 * ((Jacobian(1, 1) - Jacobian(1, 0)) * (Jacobian(3, 0) - Jacobian(3, 2)) -
                              (Jacobian(1, 2) - Jacobian(1, 0)) * (Jacobian(3, 0) - Jacobian(3, 1))) +
                     zeta4 * ((Jacobian(1, 2) - Jacobian(1, 1)) * (Jacobian(3, 3) - Jacobian(3, 1)) -
                              (Jacobian(1, 3) - Jacobian(1, 1)) * (Jacobian(3, 2) - Jacobian(3, 1)))) /
                    Jdet;
    mmatrB(1, 25) = 4 *
                    (zeta2 * ((Jacobian(1, 1) - Jacobian(1, 0)) * (Jacobian(3, 0) - Jacobian(3, 2)) -
                              (Jacobian(1, 2) - Jacobian(1, 0)) * (Jacobian(3, 0) - Jacobian(3, 1))) +
                     zeta4 * ((Jacobian(1, 3) - Jacobian(1, 2)) * (Jacobian(3, 2) - Jacobian(3, 0)) -
                              (Jacobian(1, 0) - Jacobian(1, 2)) * (Jacobian(3, 2) - Jacobian(3, 3)))) /
                    Jdet;
    mmatrB(1, 28) = 4 *
                    (zeta3 * ((Jacobian(1, 1) - Jacobian(1, 0)) * (Jacobian(3, 0) - Jacobian(3, 2)) -
                              (Jacobian(1, 2) - Jacobian(1, 0)) * (Jacobian(3, 0) - Jacobian(3, 1))) +
                     zeta4 * ((Jacobian(1, 0) - Jacobian(1, 3)) * (Jacobian(3, 1) - Jacobian(3, 3)) -
                              (Jacobian(1, 1) - Jacobian(1, 3)) * (Jacobian(3, 0) - Jacobian(3, 3)))) /
                    Jdet;

    mmatrB(2, 2) = (4 * zeta1 - 1) *
                   ((Jacobian(1, 3) - Jacobian(1, 1)) * (Jacobian(2, 2) - Jacobian(2, 1)) -
                    (Jacobian(1, 2) - Jacobian(1, 1)) * (Jacobian(2, 3) - Jacobian(2, 1))) /
                   Jdet;
    mmatrB(2, 5) = (4 * zeta2 - 1) *
                   ((Jacobian(1, 2) - Jacobian(1, 0)) * (Jacobian(2, 3) - Jacobian(2, 2)) -
                    (Jacobian(1, 2) - Jacobian(1, 3)) * (Jacobian(2, 0) - Jacobian(2, 2))) /
                   Jdet;
    mmatrB(2, 8) = (4 * zeta3 - 1) *
                   ((Jacobian(1, 1) - Jacobian(1, 3)) * (Jacobian(2, 0) - Jacobian(2, 3)) -
                    (Jacobian(1, 0) - Jacobian(1, 3)) * (Jacobian(2, 1) - Jacobian(2, 3))) /
                   Jdet;
    mmatrB(2, 11) = (4 * zeta4 - 1) *
                    ((Jacobian(1, 0) - Jacobian(1, 2)) * (Jacobian(2, 1) - Jacobian(2, 0)) -
                     (Jacobian(1, 0) - Jacobian(1, 1)) * (Jacobian(2, 2) - Jacobian(2, 0))) /
                    Jdet;
    mmatrB(2, 14) = 4 *
                    (zeta1 * ((Jacobian(1, 2) - Jacobian(1, 0)) * (Jacobian(2, 3) - Jacobian(2, 2)) -
                              (Jacobian(1, 2) - Jacobian(1, 3)) * (Jacobian(2, 0) - Jacobian(2, 2))) +
                     zeta2 * ((Jacobian(1, 3) - Jacobian(1, 1)) * (Jacobian(2, 2) - Jacobian(2, 1)) -
                              (Jacobian(1, 2) - Jacobian(1, 1)) * (Jacobian(2, 3) - Jacobian(2, 1)))) /
                    Jdet;
    mmatrB(2, 17) = 4 *
                    (zeta2 * ((Jacobian(1, 1) - Jacobian(1, 3)) * (Jacobian(2, 0) - Jacobian(2, 3)) -
                              (Jacobian(1, 0) - Jacobian(1, 3)) * (Jacobian(2, 1) - Jacobian(2, 3))) +
                     zeta3 * ((Jacobian(1, 2) - Jacobian(1, 0)) * (Jacobian(2, 3) - Jacobian(2, 2)) -
                              (Jacobian(1, 2) - Jacobian(1, 3)) * (Jacobian(2, 0) - Jacobian(2, 2)))) /
                    Jdet;
    mmatrB(2, 20) = 4 *
                    (zeta3 * ((Jacobian(1, 3) - Jacobian(1, 1)) * (Jacobian(2, 2) - Jacobian(2, 1)) -
                              (Jacobian(1, 2) - Jacobian(1, 1)) * (Jacobian(2, 3) - Jacobian(2, 1))) +
                     zeta1 * ((Jacobian(1, 1) - Jacobian(1, 3)) * (Jacobian(2, 0) - Jacobian(2, 3)) -
                              (Jacobian(1, 0) - Jacobian(1, 3)) * (Jacobian(2, 1) - Jacobian(2, 3)))) /
                    Jdet;
    mmatrB(2, 23) = 4 *
                    (zeta1 * ((Jacobian(1, 0) - Jacobian(1, 2)) * (Jacobian(2, 1) - Jacobian(2, 0)) -
                              (Jacobian(1, 0) - Jacobian(1, 1)) * (Jacobian(2, 2) - Jacobian(2, 0))) +
                     zeta4 * ((Jacobian(1, 3) - Jacobian(1, 1)) * (Jacobian(2, 2) - Jacobian(2, 1)) -
                              (Jacobian(1, 2) - Jacobian(1, 1)) * (Jacobian(2, 3) - Jacobian(2, 1)))) /
                    Jdet;
    mmatrB(2, 26) = 4 *
                    (zeta2 * ((Jacobian(1, 0) - Jacobian(1, 2)) * (Jacobian(2, 1) - Jacobian(2, 0)) -
                              (Jacobian(1, 0) - Jacobian(1, 1)) * (Jacobian(2, 2) - Jacobian(2, 0))) +
                     zeta4 * ((Jacobian(1, 2) - Jacobian(1, 0)) * (Jacobian(2, 3) - Jacobian(2, 2)) -
                              (Jacobian(1, 2) - Jacobian(1, 3)) * (Jacobian(2, 0) - Jacobian(2, 2)))) /
                    Jdet;
    mmatrB(2, 29) = 4 *
                    (zeta3 * ((Jacobian(1, 0) - Jacobian(1, 2)) * (Jacobian(2, 1) - Jacobian(2, 0)) -
                              (Jacobian(1, 0) - Jacobian(1, 1)) * (Jacobian(2, 2) - Jacobian(2, 0))) +
                     zeta4 * ((Jacobian(1, 1) - Jacobian(1, 3)) * (Jacobian(2, 0) - Jacobian(2, 3)) -
                              (Jacobian(1, 0) - Jacobian(1, 3)) * (Jacobian(2, 1) - Jacobian(2, 3)))) /
                    Jdet;

    mmatrB(3, 0) = mmatrB(1, 1);
    mmatrB(3, 1) = mmatrB(0, 0);
    mmatrB(3, 3) = mmatrB(1, 4);
    mmatrB(3, 4) = mmatrB(0, 3);
    mmatrB(3, 6) = mmatrB(1, 7);
    mmatrB(3, 7) = mmatrB(0, 6);
    mmatrB(3, 9) = mmatrB(1, 10);
    mmatrB(3, 10) = mmatrB(0, 9);
    mmatrB(3, 12) = mmatrB(1, 13);
    mmatrB(3, 13) = mmatrB(0, 12);
    mmatrB(3, 15) = mmatrB(1, 16);
    mmatrB(3, 16) = mmatrB(0, 15);
    mmatrB(3, 18) = mmatrB(1, 19);
    mmatrB(3, 19) = mmatrB(0, 18);
    mmatrB(3, 21) = mmatrB(1, 22);
    mmatrB(3, 22) = mmatrB(0, 21);
    mmatrB(3, 24) = mmatrB(1, 25);
    mmatrB(3, 25) = mmatrB(0, 24);
    mmatrB(3, 27) = mmatrB(1, 28);
    mmatrB(3, 28) = mmatrB(0, 27);

    mmatrB(4, 1) = mmatrB(2, 2);
    mmatrB(4, 2) = mmatrB(1, 1);
    mmatrB(4, 4) = mmatrB(2, 5);
    mmatrB(4, 5) = mmatrB(1, 4);
    mmatrB(4, 7) = mmatrB(2, 8);
    mmatrB(4, 8) = mmatrB(1, 7);
    mmatrB(4, 10) = mmatrB(2, 11);
    mmatrB(4, 11) = mmatrB(1, 10);
    mmatrB(4, 13) = mmatrB(2, 14);
    mmatrB(4, 14) = mmatrB(1, 13);
    mmatrB(4, 16) = mmatrB(2, 17);
    mmatrB(4, 17) = mmatrB(1, 16);
    mmatrB(4, 19) = mmatrB(2, 20);
    mmatrB(4, 20) = mmatrB(1, 19);
    mmatrB(4, 22) = mmatrB(2, 23);
    mmatrB(4, 23) = mmatrB(1, 22);
    mmatrB(4, 25) = mmatrB(2, 26);
    mmatrB(4, 26) = mmatrB(1, 25);
    mmatrB(4, 28) = mmatrB(2, 29);
    mmatrB(4, 29) = mmatrB(1, 28);

    mmatrB(5, 0) = mmatrB(2, 2);
    mmatrB(5, 2) = mmatrB(0, 0);
    mmatrB(5, 3) = mmatrB(2, 5);
    mmatrB(5, 5) = mmatrB(0, 3);
    mmatrB(5, 6) = mmatrB(2, 8);
    mmatrB(5, 8) = mmatrB(0, 6);
    mmatrB(5, 9) = mmatrB(2, 11);
    mmatrB(5, 11) = mmatrB(0, 9);
    mmatrB(5, 12) = mmatrB(2, 14);
    mmatrB(5, 14) = mmatrB(0, 12);
    mmatrB(5, 15) = mmatrB(2, 17);
    mmatrB(5, 17) = mmatrB(0, 15);
    mmatrB(5, 18) = mmatrB(2, 20);
    mmatrB(5, 20) = mmatrB(0, 18);
    mmatrB(5, 21) = mmatrB(2, 23);
    mmatrB(5, 23) = mmatrB(0, 21);
    mmatrB(5, 24) = mmatrB(2, 26);
    mmatrB(5, 26) = mmatrB(0, 24);
    mmatrB(5, 27) = mmatrB(2, 29);
    mmatrB(5, 29) = mmatrB(0, 27);

    mmatrB *= 2;
}